

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::LightHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,LightHandle *this)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ProjectionLight *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  this_00 = (ProjectionLight *)(uVar1 & 0xffffffffffff);
  if (this_00 == (ProjectionLight *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else {
    uVar2 = (ushort)(uVar1 >> 0x30);
    uVar3 = (uint)uVar2;
    if (uVar1 >> 0x30 < 5) {
      if (uVar3 < 3) {
        if (uVar3 == 2) {
          DistantLight::ToString_abi_cxx11_(__return_storage_ptr__,(DistantLight *)this_00);
        }
        else {
          PointLight::ToString_abi_cxx11_(__return_storage_ptr__,(PointLight *)this_00);
        }
      }
      else if ((uVar3 & 6) == 2) {
        ProjectionLight::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
      else {
        GoniometricLight::ToString_abi_cxx11_(__return_storage_ptr__,(GoniometricLight *)this_00);
      }
    }
    else {
      uVar4 = uVar2 - 4;
      if (uVar4 < 3) {
        if (uVar4 == 2) {
          DiffuseAreaLight::ToString_abi_cxx11_(__return_storage_ptr__,(DiffuseAreaLight *)this_00);
        }
        else {
          SpotLight::ToString_abi_cxx11_(__return_storage_ptr__,(SpotLight *)this_00);
        }
      }
      else if (uVar3 - 6 < 2) {
        UniformInfiniteLight::ToString_abi_cxx11_
                  (__return_storage_ptr__,(UniformInfiniteLight *)this_00);
      }
      else if (uVar3 - 6 == 2) {
        ImageInfiniteLight::ToString_abi_cxx11_
                  (__return_storage_ptr__,(ImageInfiniteLight *)this_00);
      }
      else {
        PortalImageInfiniteLight::ToString_abi_cxx11_
                  (__return_storage_ptr__,(PortalImageInfiniteLight *)this_00);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LightHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto str = [](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(str);
}